

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

BYTE * __thiscall
Js::WebAssemblySharedArrayBuffer::AllocBuffer
          (WebAssemblySharedArrayBuffer *this,uint32 length,uint32 maxLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *this_00;
  Memory *this_01;
  uchar *puVar4;
  TrackAllocData local_50;
  uint local_24;
  uint32 local_20;
  uint32 additionalSize;
  uint32 maxLength_local;
  uint32 length_local;
  WebAssemblySharedArrayBuffer *this_local;
  
  local_20 = maxLength;
  additionalSize = length;
  _maxLength_local = this;
  if (maxLength < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x26d,"(maxLength >= length)","maxLength >= length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_24 = local_20 - additionalSize;
  if (local_24 != 0) {
    this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    bVar2 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,(ulong)local_24);
    if (!bVar2) {
      return (BYTE *)0x0;
    }
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&unsigned_char::typeinfo,0,(ulong)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
             ,0x279);
  this_01 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
  puVar4 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_char,true>
                     (this_01,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,(ulong)local_20
                     );
  return puVar4;
}

Assistant:

BYTE* WebAssemblySharedArrayBuffer::AllocBuffer(uint32 length, uint32 maxLength)
    {
#if ENABLE_FAST_ARRAYBUFFER
        if (CONFIG_FLAG(WasmFastArray))
        {
            return (BYTE*)WasmVirtualAllocator(length);
        }
#endif
#ifdef _WIN32
        if (CONFIG_FLAG(WasmSharedArrayVirtualBuffer))
        {
            return (BYTE*)AllocWrapper(length, maxLength);
        }
#endif
        AssertOrFailFast(maxLength >= length);
        uint32 additionalSize = maxLength - length;
        if (additionalSize > 0)
        {
            // SharedArrayBuffer::Init already requested External Memory for `length`, we need to request the balance
            if (!this->GetRecycler()->RequestExternalMemoryAllocation(additionalSize))
            {
                // Failed to request for more memory
                return nullptr;
            }
        }
        // Allocate the full size of the buffer if we can't do VirtualAlloc
        return HeapNewNoThrowArray(BYTE, maxLength);
    }